

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O0

Value * getOutput(string *str)

{
  undefined1 uVar1;
  istream *piVar2;
  undefined8 in_RSI;
  Value *in_RDI;
  Reader reader;
  string s;
  string line;
  Value ans;
  ifstream fin;
  char *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  ValueType type;
  Value *pVVar3;
  Value *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  Reader *in_stack_fffffffffffffc70;
  Reader *in_stack_fffffffffffffc80;
  Value *in_stack_fffffffffffffc98;
  Value *in_stack_fffffffffffffca0;
  string local_290 [32];
  string local_270 [88];
  istream local_218 [536];
  
  type = (ValueType)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  pVVar3 = in_RDI;
  std::ifstream::ifstream(local_218,in_RSI,8);
  Json::Value::Value(in_RDI,type);
  std::__cxx11::string::string(local_270);
  std::__cxx11::string::string(local_290);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_270);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!(bool)uVar1) break;
    std::__cxx11::string::operator+=(local_290,local_270);
  }
  std::ifstream::close();
  Json::Reader::Reader(in_stack_fffffffffffffc80);
  Json::Reader::parse(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
                      SUB81((ulong)pVVar3 >> 0x38,0));
  Json::Value::operator[]
            ((Value *)CONCAT17(uVar1,in_stack_fffffffffffffc40),in_stack_fffffffffffffc38);
  Json::Value::Value(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  Json::Reader::~Reader((Reader *)CONCAT17(uVar1,in_stack_fffffffffffffc40));
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_270);
  Json::Value::~Value((Value *)in_stack_fffffffffffffc70);
  std::ifstream::~ifstream(local_218);
  return pVVar3;
}

Assistant:

Json::Value getOutput(string str)
{
    ifstream fin(str);
    Json::Value ans;
    string line, s;
    while (getline(fin, line))
        s += line;
    fin.close();
    Json::Reader reader;
    reader.parse(s, ans);
    return ans["response"];
}